

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char8_t>::operator()
          (default_arg_formatter<char8_t> *this,void *value)

{
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar1;
  basic_format_specs<char8_t> local_10;
  
  local_10.width = 0;
  local_10.precision = -1;
  local_10.type = none;
  local_10._9_2_ = local_10._9_2_ & 0xfe00;
  local_10.fill.data_[0] = ' ';
  local_10.fill.data_[1] = '\0';
  local_10.fill.data_[2] = '\0';
  local_10.fill.data_[3] = '\0';
  local_10.fill.size_ = '\x01';
  bVar1 = write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_void,_0>
                    ((this->out).container,value,&local_10,(locale_ref)0x0);
  return (iterator)bVar1.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }